

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

void stream(void)

{
  ostream *poVar1;
  undefined1 local_a8 [56];
  savebuf sbuf;
  streambuf *coutbuf;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\n");
  poVar1 = std::operator<<(poVar1,"======================================================");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"     STREAM                                           ");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"======================================================");
  poVar1 = std::operator<<(poVar1,"\n");
  std::operator<<(poVar1,"\n");
  sbuf._96_8_ = std::ios::rdbuf();
  agr::savebuf::savebuf((savebuf *)(local_a8 + 0x30),(streambuf *)sbuf._96_8_);
  std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  std::operator<<((ostream *)&std::cout,"This string");
  std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  poVar1 = std::operator<<((ostream *)&std::cout,"\nI have saved: ");
  agr::savebuf::str_abi_cxx11_((savebuf *)local_a8);
  poVar1 = std::operator<<(poVar1,(string *)local_a8);
  std::operator<<(poVar1,"\n\n");
  std::__cxx11::string::~string((string *)local_a8);
  agr::savebuf::~savebuf((savebuf *)(local_a8 + 0x30));
  return;
}

Assistant:

void stream()
 {
  std::cout << "\n" << "======================================================" << "\n"
                      << "     STREAM                                           " << "\n"
                      << "======================================================" << "\n"

                      << "\n";

  //Store the output of a stream using the savebuf class
  std::streambuf* coutbuf = std::cout.rdbuf();
  agr::savebuf sbuf( coutbuf );
  std::cout.rdbuf( &sbuf );
  std::cout << "This string";
  std::cout.rdbuf( coutbuf ); // restore the original stream buffer
  std::cout << "\nI have saved: " << sbuf.str() << "\n\n";
 }